

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_coin.cpp
# Opt level: O1

void __thiscall cfdcapi_coin_EstimateFeeTest_Test::TestBody(cfdcapi_coin_EstimateFeeTest_Test *this)

{
  void *fee_handle_00;
  void *handle_00;
  bool bVar1;
  long lVar2;
  pointer pUVar3;
  char *pcVar4;
  Script *locking_script;
  Amount AVar5;
  initializer_list<cfd::UtxoData> __l;
  allocator_type local_1539;
  Script local_1538;
  Script local_1500;
  pointer local_14c8;
  int ret;
  string local_1488;
  string local_1468;
  string local_1448;
  string local_1428;
  string local_1408;
  string local_13e8;
  string local_13c8;
  string local_13a8;
  string local_1388;
  string local_1368;
  string local_1348;
  string local_1328;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  Amount local_12f0;
  Txid local_12e0;
  BlockHash local_12c0;
  Amount local_12a0;
  Txid local_1290;
  BlockHash local_1270;
  BlindFactor local_1250;
  BlindFactor local_1230;
  BlindFactor local_1210;
  BlindFactor local_11f0;
  ConfidentialAssetId local_11d0;
  ConfidentialValue local_11a8;
  ConfidentialValue local_1180;
  ConfidentialAssetId local_1158;
  AddressFactory factory;
  int64_t tx_fee;
  _Alloc_hider local_10f8;
  char local_10e8 [16];
  pointer local_10d8;
  pointer local_10c0;
  pointer local_10a8;
  TapBranch local_1090;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_1018;
  Script local_1000;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_fc0;
  int64_t utxo_fee;
  _Alloc_hider local_f80;
  char local_f70 [16];
  pointer local_f60;
  pointer local_f48;
  pointer local_f30;
  TapBranch local_f18;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_ea0;
  Script local_e88;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e48;
  Script local_e18;
  Script local_de0;
  Script local_da8;
  void *fee_handle;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d68 [53];
  AssertionResult gtest_ar;
  undefined1 local_bb0 [1248];
  UtxoData local_6d0;
  void *handle;
  
  cfd::AddressFactory::AddressFactory(&factory);
  local_1328._M_dataplus._M_p = (pointer)&local_1328.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1328,
             "590ba2283fbe5fb9363c74417bc1cb3f76d4df9d31890f9124b9e1706136b4f4","");
  cfd::core::BlockHash::BlockHash(&local_1270,&local_1328);
  local_1348._M_dataplus._M_p = (pointer)&local_1348.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1348,
             "ffe2f9aa4e2c2adb1676008aa07aec5f64149470abb5d89d91b26dfba14e9318","");
  cfd::core::Txid::Txid(&local_1290,&local_1348);
  local_1368._M_dataplus._M_p = (pointer)&local_1368.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1368,"a914155801788fcd51f57e097a0b6c30f1b69057290d87","");
  cfd::core::Script::Script(&local_1538,&local_1368);
  local_1388._M_dataplus._M_p = (pointer)&local_1388.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1388,"001477567d12cf82a3ef6e9bb0ab3a1aba7f65410cbd","");
  cfd::core::Script::Script(&local_1500,&local_1388);
  local_13a8._M_dataplus._M_p = (pointer)&local_13a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_13a8,"33dsYKS5E5Vp3LhAw3krvhzNaWtqmrH29k","");
  cfd::AddressFactory::GetAddress((Address *)&tx_fee,&factory,&local_13a8);
  local_13c8._M_dataplus._M_p = (pointer)&local_13c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_13c8,
             "sh(wpkh([ef735203/0\'/0\'/5\']03948c01f159b4204b682668d6e850440564b6610c0e5bf30da684b2131f77c449))#2u75feqc"
             ,"");
  AVar5 = cfd::core::Amount::CreateBySatoshiAmount(600000000);
  local_12a0.amount_ = AVar5.amount_;
  local_12a0.ignore_check_ = AVar5.ignore_check_;
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_1158);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)&fee_handle);
  cfd::core::BlindFactor::BlindFactor(&local_11f0);
  cfd::core::BlindFactor::BlindFactor(&local_1210);
  cfd::core::ConfidentialValue::ConfidentialValue(&local_1180);
  cfd::core::Script::Script((Script *)&ret);
  cfd::UtxoData::UtxoData
            ((UtxoData *)&gtest_ar,0xc,&local_1270,&local_1290,0,&local_1538,&local_1500,
             (Address *)&tx_fee,&local_13c8,&local_12a0,0,(void *)0x0,&local_1158,
             (ElementsConfidentialAddress *)&fee_handle,&local_11f0,&local_1210,&local_1180,
             (Script *)&ret);
  local_13e8._M_dataplus._M_p = (pointer)&local_13e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_13e8,
             "e05419389a3aa71017eb4dd1d9eec73500971b86aab2eb0db116707c7be67996","");
  cfd::core::BlockHash::BlockHash(&local_12c0,&local_13e8);
  local_1408._M_dataplus._M_p = (pointer)&local_1408.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1408,
             "d68154ae19408850308967b2cb1b84a92166829610fb2321548b655c4a747c79","");
  cfd::core::Txid::Txid(&local_12e0,&local_1408);
  local_1428._M_dataplus._M_p = (pointer)&local_1428.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1428,"a914155801788fcd51f57e097a0b6c30f1b69057290d87","");
  cfd::core::Script::Script(&local_de0,&local_1428);
  local_1448._M_dataplus._M_p = (pointer)&local_1448.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1448,"001477567d12cf82a3ef6e9bb0ab3a1aba7f65410cbd","");
  cfd::core::Script::Script(&local_e18,&local_1448);
  local_1468._M_dataplus._M_p = (pointer)&local_1468.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1468,"33dsYKS5E5Vp3LhAw3krvhzNaWtqmrH29k","");
  cfd::AddressFactory::GetAddress((Address *)&utxo_fee,&factory,&local_1468);
  local_1488._M_dataplus._M_p = (pointer)&local_1488.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1488,
             "sh(wpkh([ef735203/0\'/0\'/5\']03948c01f159b4204b682668d6e850440564b6610c0e5bf30da684b2131f77c449))#2u75feqc"
             ,"");
  AVar5 = cfd::core::Amount::CreateBySatoshiAmount(700000000);
  local_12f0.amount_ = AVar5.amount_;
  local_12f0.ignore_check_ = AVar5.ignore_check_;
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_11d0);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)&handle);
  cfd::core::BlindFactor::BlindFactor(&local_1230);
  cfd::core::BlindFactor::BlindFactor(&local_1250);
  cfd::core::ConfidentialValue::ConfidentialValue(&local_11a8);
  cfd::core::Script::Script(&local_da8);
  locking_script = &local_de0;
  cfd::UtxoData::UtxoData
            (&local_6d0,0x16,&local_12c0,&local_12e0,0,locking_script,&local_e18,
             (Address *)&utxo_fee,&local_1488,&local_12f0,0,(void *)0x0,&local_11d0,
             (ElementsConfidentialAddress *)&handle,&local_1230,&local_1250,&local_11a8,&local_da8);
  __l._M_len = 2;
  __l._M_array = (iterator)&gtest_ar;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector(&utxos,__l,&local_1539);
  lVar2 = 0x4f0;
  do {
    cfd::UtxoData::~UtxoData((UtxoData *)(local_bb0 + lVar2 + -0x10));
    lVar2 = lVar2 + -0x4f0;
  } while (lVar2 != -0x4f0);
  cfd::core::Script::~Script(&local_da8);
  local_11a8._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_007357f0;
  if (local_11a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_11a8.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_1250._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_007354b0;
  if (local_1250.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1250.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_1230._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_007354b0;
  if (local_1230.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1230.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)&handle);
  local_11d0._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_00735710;
  if (local_11d0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_11d0.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1488._M_dataplus._M_p != &local_1488.field_2) {
    operator_delete(local_1488._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_e48);
  cfd::core::Script::~Script(&local_e88);
  local_f18._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_00740b18;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_ea0);
  cfd::core::TapBranch::~TapBranch(&local_f18);
  if (local_f30 != (pointer)0x0) {
    operator_delete(local_f30);
  }
  if (local_f48 != (pointer)0x0) {
    operator_delete(local_f48);
  }
  if (local_f60 != (pointer)0x0) {
    operator_delete(local_f60);
  }
  if (local_f80._M_p != local_f70) {
    operator_delete(local_f80._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1468._M_dataplus._M_p != &local_1468.field_2) {
    operator_delete(local_1468._M_dataplus._M_p);
  }
  cfd::core::Script::~Script(&local_e18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1448._M_dataplus._M_p != &local_1448.field_2) {
    operator_delete(local_1448._M_dataplus._M_p);
  }
  cfd::core::Script::~Script(&local_de0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1428._M_dataplus._M_p != &local_1428.field_2) {
    operator_delete(local_1428._M_dataplus._M_p);
  }
  local_12e0._vptr_Txid = (_func_int **)&PTR__Txid_00735400;
  if (local_12e0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_12e0.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1408._M_dataplus._M_p != &local_1408.field_2) {
    operator_delete(local_1408._M_dataplus._M_p);
  }
  local_12c0._vptr_BlockHash = (_func_int **)&PTR__BlockHash_00735740;
  if (local_12c0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_12c0.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_13e8._M_dataplus._M_p != &local_13e8.field_2) {
    operator_delete(local_13e8._M_dataplus._M_p);
  }
  cfd::core::Script::~Script((Script *)&ret);
  local_1180._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_007357f0;
  if (local_1180.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1180.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_1210._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_007354b0;
  if (local_1210.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1210.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_11f0._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_007354b0;
  if (local_11f0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_11f0.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)&fee_handle);
  local_1158._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_00735710;
  if (local_1158.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1158.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_13c8._M_dataplus._M_p != &local_13c8.field_2) {
    operator_delete(local_13c8._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_fc0);
  cfd::core::Script::~Script(&local_1000);
  local_1090._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_00740b18;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_1018)
  ;
  cfd::core::TapBranch::~TapBranch(&local_1090);
  if (local_10a8 != (pointer)0x0) {
    operator_delete(local_10a8);
  }
  if (local_10c0 != (pointer)0x0) {
    operator_delete(local_10c0);
  }
  if (local_10d8 != (pointer)0x0) {
    operator_delete(local_10d8);
  }
  if (local_10f8._M_p != local_10e8) {
    operator_delete(local_10f8._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_13a8._M_dataplus._M_p != &local_13a8.field_2) {
    operator_delete(local_13a8._M_dataplus._M_p);
  }
  cfd::core::Script::~Script(&local_1500);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1388._M_dataplus._M_p != &local_1388.field_2) {
    operator_delete(local_1388._M_dataplus._M_p);
  }
  cfd::core::Script::~Script(&local_1538);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1368._M_dataplus._M_p != &local_1368.field_2) {
    operator_delete(local_1368._M_dataplus._M_p);
  }
  local_1290._vptr_Txid = (_func_int **)&PTR__Txid_00735400;
  if (local_1290.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1290.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1348._M_dataplus._M_p != &local_1348.field_2) {
    operator_delete(local_1348._M_dataplus._M_p);
  }
  local_1270._vptr_BlockHash = (_func_int **)&PTR__BlockHash_00735740;
  if (local_1270.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1270.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1328._M_dataplus._M_p != &local_1328.field_2) {
    operator_delete(local_1328._M_dataplus._M_p);
  }
  handle = (void *)0x0;
  ret = CfdCreateHandle(&handle);
  fee_handle = (void *)((ulong)fee_handle._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&fee_handle,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&fee_handle);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&tx_fee,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_coin.cpp"
               ,0x74,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&tx_fee,(Message *)&fee_handle);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tx_fee);
    if (fee_handle != (void *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (fee_handle != (void *)0x0)) {
        (**(code **)(*fee_handle + 8))();
      }
      fee_handle = (void *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  fee_handle = (void *)CONCAT71(fee_handle._1_7_,handle != (void *)0x0);
  local_d68[0].ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (handle == (void *)0x0) {
    testing::Message::Message((Message *)&tx_fee);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&fee_handle,(AssertionResult *)"(NULL == handle)",
               "true","false",(char *)locking_script);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&utxo_fee,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_coin.cpp"
               ,0x75,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&utxo_fee,(Message *)&tx_fee);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&utxo_fee);
    if ((undefined1 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != local_bb0) {
      operator_delete((undefined1 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    }
    if (tx_fee != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (tx_fee != 0)) {
        (**(code **)(*(long *)tx_fee + 8))();
      }
      tx_fee = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_d68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  fee_handle = (void *)0x0;
  ret = CfdInitializeEstimateFee(handle,&fee_handle,false);
  tx_fee = tx_fee & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&tx_fee,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&tx_fee);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&utxo_fee,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_coin.cpp"
               ,0x79,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&utxo_fee,(Message *)&tx_fee);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&utxo_fee);
    if (tx_fee != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (tx_fee != 0)) {
        (**(code **)(*(long *)tx_fee + 8))();
      }
      tx_fee = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if (ret == 0) {
    local_14c8 = utxos.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
                 super__Vector_impl_data._M_finish;
    if (utxos.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
        super__Vector_impl_data._M_start !=
        utxos.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pUVar3 = utxos.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        handle_00 = handle;
        fee_handle_00 = fee_handle;
        cfd::core::Txid::GetHex_abi_cxx11_((string *)&gtest_ar,&pUVar3->txid);
        ret = CfdAddTxInForEstimateFee
                        (handle_00,fee_handle_00,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_),
                         pUVar3->vout,(pUVar3->descriptor)._M_dataplus._M_p,(char *)0x0,false,false,
                         false,0,(char *)0x0);
        if ((undefined1 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != local_bb0) {
          operator_delete((undefined1 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        }
        tx_fee = tx_fee & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<CfdErrorCode,int>
                  ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&tx_fee,&ret);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&tx_fee);
          pcVar4 = "";
          if (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&utxo_fee,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_coin.cpp"
                     ,0x85,pcVar4);
          testing::internal::AssertHelper::operator=((AssertHelper *)&utxo_fee,(Message *)&tx_fee);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&utxo_fee);
          if (tx_fee != 0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) && (tx_fee != 0)) {
              (**(code **)(*(long *)tx_fee + 8))();
            }
            tx_fee = 0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&gtest_ar.message_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        pUVar3 = pUVar3 + 1;
      } while (pUVar3 != local_14c8);
    }
    ret = CfdFinalizeEstimateFee
                    (handle,fee_handle,
                     "02000000034cdeada737db97af334f0fa4e87432d6068759eea65a3067d1f14a979e5a9dea0000000000ffffffff81ddd34c6c0c32544e3b89f5e24c6cd7afca62f2b5069281ac9fced6251191d20000000000ffffffff81ddd34c6c0c32544e3b89f5e24c6cd7afca62f2b5069281ac9fced6251191d20100000000ffffffff030200000000000000220020c5ae4ff17cec055e964b573601328f3f879fa441e53ef88acdfd4d8e8df429ef406f400100000000220020ea5a7208cddfbc20dd93e12bf29deb00b68c056382a502446c9c5b55490954d215cd5b0700000000220020f39f6272ba6b57918eb047c5dc44fb475356b0f24c12fca39b19284e80008a4200000000"
                     ,(char *)0x0,&tx_fee,&utxo_fee,true,20.0);
    local_1538._vptr_Script = (_func_int **)((ulong)local_1538._vptr_Script._4_4_ << 0x20);
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&local_1538,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_1538);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1500,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_coin.cpp"
                 ,0x8b,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1500,(Message *)&local_1538)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1500);
      if (local_1538._vptr_Script != (_func_int **)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_1538._vptr_Script != (_func_int **)0x0)) {
          (**(code **)(*local_1538._vptr_Script + 8))();
        }
        local_1538._vptr_Script = (_func_int **)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_1538._vptr_Script = (_func_int **)&DAT_00000b04;
    testing::internal::CmpHelperEQ<long,long>
              ((internal *)&gtest_ar,"static_cast<int64_t>(2820)","tx_fee",(long *)&local_1538,
               &tx_fee);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_1538);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1500,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_coin.cpp"
                 ,0x8c,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1500,(Message *)&local_1538)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1500);
      if (local_1538._vptr_Script != (_func_int **)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_1538._vptr_Script != (_func_int **)0x0)) {
          (**(code **)(*local_1538._vptr_Script + 8))();
        }
        local_1538._vptr_Script = (_func_int **)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_1538._vptr_Script = (_func_int **)&DAT_00000e4c;
    testing::internal::CmpHelperEQ<long,long>
              ((internal *)&gtest_ar,"static_cast<int64_t>(3660)","utxo_fee",(long *)&local_1538,
               &utxo_fee);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_1538);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1500,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_coin.cpp"
                 ,0x8d,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1500,(Message *)&local_1538)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1500);
      if (local_1538._vptr_Script != (_func_int **)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_1538._vptr_Script != (_func_int **)0x0)) {
          (**(code **)(*local_1538._vptr_Script + 8))();
        }
        local_1538._vptr_Script = (_func_int **)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    ret = CfdFreeEstimateFeeHandle(handle,fee_handle);
    local_1538._vptr_Script = (_func_int **)((ulong)local_1538._vptr_Script & 0xffffffff00000000);
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&local_1538,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_1538);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1500,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_coin.cpp"
                 ,0x90,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1500,(Message *)&local_1538)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1500);
      if (local_1538._vptr_Script != (_func_int **)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_1538._vptr_Script != (_func_int **)0x0)) {
          (**(code **)(*local_1538._vptr_Script + 8))();
        }
        local_1538._vptr_Script = (_func_int **)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  ret = CfdGetLastErrorCode(handle);
  if (ret != 0) {
    tx_fee = 0;
    ret = CfdGetLastErrorMessage(handle,(char **)&tx_fee);
    utxo_fee = utxo_fee & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&utxo_fee,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&utxo_fee);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1538,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_coin.cpp"
                 ,0x97,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1538,(Message *)&utxo_fee);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1538);
      if (utxo_fee != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (utxo_fee != 0)) {
          (**(code **)(*(long *)utxo_fee + 8))();
        }
        utxo_fee = 0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    pcVar4 = "";
    testing::internal::CmpHelperSTREQ((internal *)&gtest_ar,"\"\"","str_buffer","",(char *)tx_fee);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&utxo_fee);
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1538,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_coin.cpp"
                 ,0x98,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1538,(Message *)&utxo_fee);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1538);
      if (utxo_fee != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (utxo_fee != 0)) {
          (**(code **)(*(long *)utxo_fee + 8))();
        }
        utxo_fee = 0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    CfdFreeStringBuffer((char *)tx_fee);
  }
  ret = CfdFreeHandle(handle);
  tx_fee = tx_fee & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&tx_fee,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&tx_fee);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&utxo_fee,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_coin.cpp"
               ,0x9e,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&utxo_fee,(Message *)&tx_fee);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&utxo_fee);
    if (tx_fee != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (tx_fee != 0)) {
        (**(code **)(*(long *)tx_fee + 8))();
      }
      tx_fee = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(&utxos);
  factory._vptr_AddressFactory = (_func_int **)&PTR__AddressFactory_00733578;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (&factory.prefix_list_);
  return;
}

Assistant:

TEST(cfdcapi_coin, EstimateFeeTest) {

  AddressFactory factory;
  std::vector<UtxoData> utxos = {
    UtxoData{
      static_cast<uint32_t>(12),
      BlockHash("590ba2283fbe5fb9363c74417bc1cb3f76d4df9d31890f9124b9e1706136b4f4"),
      Txid("ffe2f9aa4e2c2adb1676008aa07aec5f64149470abb5d89d91b26dfba14e9318"),
      static_cast<uint32_t>(0),
      Script("a914155801788fcd51f57e097a0b6c30f1b69057290d87"),
      Script("001477567d12cf82a3ef6e9bb0ab3a1aba7f65410cbd"),
      factory.GetAddress("33dsYKS5E5Vp3LhAw3krvhzNaWtqmrH29k"),
      "sh(wpkh([ef735203/0\'/0\'/5\']03948c01f159b4204b682668d6e850440564b6610c0e5bf30da684b2131f77c449))#2u75feqc",
      Amount::CreateBySatoshiAmount(600000000),
      static_cast<AddressType>(0),
      nullptr,
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialAssetId(),
      ElementsConfidentialAddress(),
      BlindFactor(),
      BlindFactor(),
      ConfidentialValue(),
#endif  // CFD_DISABLE_ELEMENTS
      Script()
    },
    UtxoData{
      22,
      BlockHash("e05419389a3aa71017eb4dd1d9eec73500971b86aab2eb0db116707c7be67996"),
      Txid("d68154ae19408850308967b2cb1b84a92166829610fb2321548b655c4a747c79"),
      0,
      Script("a914155801788fcd51f57e097a0b6c30f1b69057290d87"),
      Script("001477567d12cf82a3ef6e9bb0ab3a1aba7f65410cbd"),
      factory.GetAddress("33dsYKS5E5Vp3LhAw3krvhzNaWtqmrH29k"),
      "sh(wpkh([ef735203/0\'/0\'/5\']03948c01f159b4204b682668d6e850440564b6610c0e5bf30da684b2131f77c449))#2u75feqc",
      Amount::CreateBySatoshiAmount(700000000),
      static_cast<AddressType>(0),
#ifndef CFD_DISABLE_ELEMENTS
      nullptr,
      ConfidentialAssetId(),
      ElementsConfidentialAddress(),
      BlindFactor(),
      BlindFactor(),
      ConfidentialValue(),
#else
      nullptr,
#endif  // CFD_DISABLE_ELEMENTS
      Script()
    }
  };

  // 1 output data
  static const char* const kTxData = "02000000034cdeada737db97af334f0fa4e87432d6068759eea65a3067d1f14a979e5a9dea0000000000ffffffff81ddd34c6c0c32544e3b89f5e24c6cd7afca62f2b5069281ac9fced6251191d20000000000ffffffff81ddd34c6c0c32544e3b89f5e24c6cd7afca62f2b5069281ac9fced6251191d20100000000ffffffff030200000000000000220020c5ae4ff17cec055e964b573601328f3f879fa441e53ef88acdfd4d8e8df429ef406f400100000000220020ea5a7208cddfbc20dd93e12bf29deb00b68c056382a502446c9c5b55490954d215cd5b0700000000220020f39f6272ba6b57918eb047c5dc44fb475356b0f24c12fca39b19284e80008a4200000000";

  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  void* fee_handle = nullptr;
  ret = CfdInitializeEstimateFee(handle, &fee_handle, false);
  EXPECT_EQ(kCfdSuccess, ret);

  if (ret == kCfdSuccess) {
    for (auto& utxo : utxos) {
      ret = CfdAddTxInForEstimateFee(
          handle, fee_handle, utxo.txid.GetHex().c_str(), utxo.vout,
          utxo.descriptor.c_str(), nullptr,
          false, false, false, 0, nullptr);
      //ret = CfdAddTxInputForEstimateFee(
      //    handle, fee_handle, utxo.txid.GetHex().c_str(), utxo.vout,
      //    utxo.descriptor.c_str(), nullptr,
      //    false, false, false, nullptr, 0, 0, nullptr);
      EXPECT_EQ(kCfdSuccess, ret);
    }

    int64_t tx_fee, utxo_fee;
    ret = CfdFinalizeEstimateFee(
        handle, fee_handle, kTxData, nullptr, &tx_fee, &utxo_fee, true, 20.0);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(static_cast<int64_t>(2820), tx_fee);
    EXPECT_EQ(static_cast<int64_t>(3660), utxo_fee);

    ret = CfdFreeEstimateFeeHandle(handle, fee_handle);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}